

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest_cpp03.hpp
# Opt level: O0

text * __thiscall lest::env::context_abi_cxx11_(text *__return_storage_ptr__,env *this)

{
  text local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  env *local_18;
  env *this_local;
  
  local_18 = this;
  this_local = (env *)__return_storage_ptr__;
  sections_abi_cxx11_(&local_58,this);
  std::operator+(&local_38,&this->testing,&local_58);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return __return_storage_ptr__;
}

Assistant:

text context() { return testing + sections(); }